

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int map_fill_point(dw_map *map,uint8_t **points,uint8_t x,uint8_t y,dw_tile tile)

{
  dw_tile tile_local;
  uint8_t y_local;
  uint8_t x_local;
  uint8_t **points_local;
  dw_map *map_local;
  
  if ((x < 0x78) && (y < 0x78)) {
    while (**points < 0x79) {
      *points = *points + 2;
    }
    **points = x;
    (*points)[1] = y;
    map->tiles[y][x] = (uint8_t)tile;
    if (tile == TILE_MOUNTAIN) {
      map_local._4_4_ = 2;
    }
    else {
      map_local._4_4_ = 1;
    }
  }
  else {
    map_local._4_4_ = 0;
  }
  return map_local._4_4_;
}

Assistant:

static int map_fill_point(dw_map *map, uint8_t **points,
        uint8_t x, uint8_t y, dw_tile tile)
{
    if (x >= 120 || y >= 120)
        return 0;

    for (;;) {
        if ((*points)[0] > 120) { break; }
//        if (p[0] == x && p[1] == y) return 0;
        (*points) += 2;
    }
    (*points)[0] = x;
    (*points)[1] = y;
    map->tiles[y][x] = (uint8_t)tile;
    if (tile == TILE_MOUNTAIN)
        return 2; /* not so many mountain tiles */
    return 1;
}